

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::EncryptWallet(CWallet *this,SecureString *strWalletPassphrase)

{
  Span<unsigned_char> bytes;
  Span<unsigned_char> bytes_00;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  span<const_unsigned_char,_18446744073709551615UL> salt_01;
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  CWallet *this_00;
  void *pvVar4;
  pointer pSVar5;
  LegacyScriptPubKeyMan *pLVar6;
  WalletDatabase *pWVar7;
  long in_RDI;
  long in_FS_OFFSET;
  LegacyScriptPubKeyMan *spk_man_1;
  pointer spk_man;
  pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>
  *spk_man_pair;
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  *__range2;
  WalletBatch *encrypted_batch;
  iterator __end2;
  iterator __begin2;
  time_point start;
  MillisecondsDouble target;
  CMasterKey kMasterKey;
  CKeyingMaterial _vMasterKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CCrypter crypter;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  CMasterKey *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffd30;
  CWallet *in_stack_fffffffffffffd38;
  undefined6 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  CCrypter *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined2 in_stack_fffffffffffffd54;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  CMasterKey *in_stack_fffffffffffffd58;
  uint *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  CWallet *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  CWallet *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd8c;
  WalletFeature nVersion;
  pointer in_stack_fffffffffffffd90;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd98;
  byte local_179;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsCrypted((CWallet *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  if (bVar1) {
    local_179 = 0;
    goto LAB_016f8e75;
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffd38,
             (size_type)in_stack_fffffffffffffd30);
  Span<unsigned_char>::Span<std::vector<unsigned_char,secure_allocator<unsigned_char>>>
            ((Span<unsigned_char> *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             (vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffd20,
             (type)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  bytes.m_size._0_7_ = in_stack_fffffffffffffd28;
  bytes.m_data = (uchar *)in_stack_fffffffffffffd20;
  bytes.m_size._7_1_ = in_stack_fffffffffffffd2f;
  GetStrongRandBytes(bytes);
  CMasterKey::CMasterKey(in_stack_fffffffffffffd58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd38,
             (size_type)in_stack_fffffffffffffd30);
  Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<unsigned_char> *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             &in_stack_fffffffffffffd20->vchCryptedKey,
             (type)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  bytes_00.m_size._0_7_ = in_stack_fffffffffffffd28;
  bytes_00.m_data = (uchar *)in_stack_fffffffffffffd20;
  bytes_00.m_size._7_1_ = in_stack_fffffffffffffd2f;
  GetStrongRandBytes(bytes_00);
  CCrypter::CCrypter(in_stack_fffffffffffffd48);
  std::chrono::_V2::steady_clock::now();
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             &in_stack_fffffffffffffd20->vchCryptedKey);
  salt._M_extent._M_extent_value = in_stack_fffffffffffffd98._M_extent_value;
  salt._M_ptr = in_stack_fffffffffffffd90;
  CCrypter::SetKeyFromPassphrase
            ((CCrypter *)in_stack_fffffffffffffd70,
             (SecureString *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),salt,
             (uint)((ulong)in_stack_fffffffffffffd60 >> 0x20),(uint)in_stack_fffffffffffffd60);
  std::chrono::operator*
            ((int *)in_stack_fffffffffffffd20,
             (duration<double,_std::ratio<1L,_1000L>_> *)
             CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffd20,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  std::chrono::operator/
            ((duration<double,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd30);
  std::chrono::_V2::steady_clock::now();
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             &in_stack_fffffffffffffd20->vchCryptedKey);
  salt_00._M_extent._M_extent_value = in_stack_fffffffffffffd98._M_extent_value;
  salt_00._M_ptr = in_stack_fffffffffffffd90;
  CCrypter::SetKeyFromPassphrase
            ((CCrypter *)in_stack_fffffffffffffd70,
             (SecureString *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),salt_00,
             (uint)((ulong)in_stack_fffffffffffffd60 >> 0x20),(uint)in_stack_fffffffffffffd60);
  std::chrono::operator*
            ((uint *)in_stack_fffffffffffffd20,
             (duration<double,_std::ratio<1L,_1000L>_> *)
             CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  this_00 = (CWallet *)std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffd20,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  std::chrono::operator/
            ((duration<double,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd30);
  WalletLogPrintf<unsigned_int>
            ((CWallet *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
             (ConstevalFormatString<1U>)in_stack_fffffffffffffd98._M_extent_value,
             in_stack_fffffffffffffd60);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
             &in_stack_fffffffffffffd20->vchCryptedKey);
  salt_01._M_extent._M_extent_value = in_stack_fffffffffffffd98._M_extent_value;
  salt_01._M_ptr = in_stack_fffffffffffffd90;
  bVar1 = CCrypter::SetKeyFromPassphrase
                    ((CCrypter *)in_stack_fffffffffffffd70,
                     (SecureString *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                     salt_01,(uint)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                     (uint)in_stack_fffffffffffffd60);
  if (bVar1) {
    bVar1 = CCrypter::Encrypt((CCrypter *)in_stack_fffffffffffffd80,
                              (CKeyingMaterial *)
                              CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffffd70);
    if (bVar1) {
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd58,
                 (AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT17(in_stack_fffffffffffffd57,
                          CONCAT16(in_stack_fffffffffffffd56,
                                   CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))),
                 (char *)in_stack_fffffffffffffd48,
                 (char *)CONCAT17(in_stack_fffffffffffffd47,
                                  CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
                 (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd38 >> 0x18,0));
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd58,
                 (AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT17(in_stack_fffffffffffffd57,
                          CONCAT16(in_stack_fffffffffffffd56,
                                   CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))),
                 (char *)in_stack_fffffffffffffd48,
                 (char *)CONCAT17(in_stack_fffffffffffffd47,
                                  CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
                 (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd38 >> 0x18,0));
      *(int *)(in_RDI + 0x240) = *(int *)(in_RDI + 0x240) + 1;
      std::
      map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
      ::operator[]((map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd47,
                               CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
                   (key_type_conflict3 *)in_stack_fffffffffffffd38);
      CMasterKey::operator=
                ((CMasterKey *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                 in_stack_fffffffffffffd20);
      pvVar4 = operator_new(0x10);
      GetDatabase((CWallet *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      WalletBatch::WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                 (WalletDatabase *)in_stack_fffffffffffffd20,(bool)in_stack_fffffffffffffd1f);
      bVar1 = WalletBatch::TxnBegin
                        ((WalletBatch *)
                         CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      nVersion = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd8c);
      if (bVar1) {
        WalletBatch::WriteMasterKey
                  ((WalletBatch *)in_stack_fffffffffffffd48,
                   CONCAT13(in_stack_fffffffffffffd57,
                            CONCAT12(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54)),
                   (CMasterKey *)
                   CONCAT17(in_stack_fffffffffffffd47,
                            CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)));
        std::
        map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
        ::begin((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
                 *)in_stack_fffffffffffffd20);
        std::
        map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
        ::end((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
               *)in_stack_fffffffffffffd20);
        while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffd2f,
                                                         in_stack_fffffffffffffd28),
                                       (_Self *)in_stack_fffffffffffffd20),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          std::
          _Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
          ::operator*((_Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
          pSVar5 = std::
                   unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                   ::get((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                          *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
          uVar3 = (*pSVar5->_vptr_ScriptPubKeyMan[5])(pSVar5,local_78,pvVar4);
          in_stack_fffffffffffffd7f = (undefined1)uVar3;
          if ((uVar3 & 1) == 0) {
            WalletBatch::TxnAbort
                      ((WalletBatch *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18))
            ;
            if (pvVar4 != (void *)0x0) {
              WalletBatch::~WalletBatch
                        ((WalletBatch *)
                         CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
              operator_delete(pvVar4,0x10);
            }
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                          ,0x35a,"bool wallet::CWallet::EncryptWallet(const SecureString &)");
          }
          std::
          _Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
        }
        SetMinVersion(in_stack_fffffffffffffd80,nVersion,
                      (WalletBatch *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
        uVar2 = WalletBatch::TxnCommit
                          ((WalletBatch *)
                           CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
        if (!(bool)uVar2) {
          if (pvVar4 != (void *)0x0) {
            WalletBatch::~WalletBatch
                      ((WalletBatch *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18))
            ;
            operator_delete(pvVar4,0x10);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x366,"bool wallet::CWallet::EncryptWallet(const SecureString &)");
        }
        if (pvVar4 != (void *)0x0) {
          WalletBatch::~WalletBatch
                    ((WalletBatch *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
          operator_delete(pvVar4,0x10);
        }
        Lock((CWallet *)
             CONCAT17(in_stack_fffffffffffffd57,
                      CONCAT16(in_stack_fffffffffffffd56,
                               CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))));
        Unlock(in_stack_fffffffffffffd70,(SecureString *)CONCAT17(uVar2,in_stack_fffffffffffffd68));
        uVar2 = IsWalletFlagSet((CWallet *)
                                CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                                (uint64_t)in_stack_fffffffffffffd20);
        if ((!(bool)uVar2) ||
           (in_stack_fffffffffffffd56 =
                 IsWalletFlagSet((CWallet *)
                                 CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                                 (uint64_t)in_stack_fffffffffffffd20),
           (bool)in_stack_fffffffffffffd56)) {
          pLVar6 = GetLegacyScriptPubKeyMan(in_stack_fffffffffffffd38);
          if ((pLVar6 != (LegacyScriptPubKeyMan *)0x0) &&
             ((uVar3 = (*(pLVar6->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan
                         [0xc])(), (uVar3 & 1) != 0 &&
              (uVar3 = (*(pLVar6->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan
                         [0xb])(pLVar6,1), (uVar3 & 1) == 0)))) {
            local_179 = 0;
            bVar1 = true;
            goto LAB_016f8db2;
          }
        }
        else {
          SetupDescriptorScriptPubKeyMans(this_00);
        }
        Lock((CWallet *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd56,
                                     CONCAT24(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)))
            );
        pWVar7 = GetDatabase((CWallet *)
                             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
        (*pWVar7->_vptr_WalletDatabase[5])(pWVar7,0);
        pWVar7 = GetDatabase((CWallet *)
                             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
        (*pWVar7->_vptr_WalletDatabase[0xb])();
        bVar1 = false;
      }
      else {
        if (pvVar4 != (void *)0x0) {
          WalletBatch::~WalletBatch
                    ((WalletBatch *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
          operator_delete(pvVar4,0x10);
        }
        local_179 = 0;
        bVar1 = true;
      }
LAB_016f8db2:
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      if (!bVar1) {
        boost::signals2::
        signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
        ::operator()((signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
                      *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                     (CWallet *)0x16f8df0);
        local_179 = 1;
      }
    }
    else {
      local_179 = 0;
    }
  }
  else {
    local_179 = 0;
  }
  CCrypter::~CCrypter((CCrypter *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  CMasterKey::~CMasterKey
            ((CMasterKey *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
LAB_016f8e75:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_179 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::EncryptWallet(const SecureString& strWalletPassphrase)
{
    if (IsCrypted())
        return false;

    CKeyingMaterial _vMasterKey;

    _vMasterKey.resize(WALLET_CRYPTO_KEY_SIZE);
    GetStrongRandBytes(_vMasterKey);

    CMasterKey kMasterKey;

    kMasterKey.vchSalt.resize(WALLET_CRYPTO_SALT_SIZE);
    GetStrongRandBytes(kMasterKey.vchSalt);

    CCrypter crypter;
    constexpr MillisecondsDouble target{100};
    auto start{SteadyClock::now()};
    crypter.SetKeyFromPassphrase(strWalletPassphrase, kMasterKey.vchSalt, 25000, kMasterKey.nDerivationMethod);
    kMasterKey.nDeriveIterations = static_cast<unsigned int>(25000 * target / (SteadyClock::now() - start));

    start = SteadyClock::now();
    crypter.SetKeyFromPassphrase(strWalletPassphrase, kMasterKey.vchSalt, kMasterKey.nDeriveIterations, kMasterKey.nDerivationMethod);
    kMasterKey.nDeriveIterations = (kMasterKey.nDeriveIterations + static_cast<unsigned int>(kMasterKey.nDeriveIterations * target / (SteadyClock::now() - start))) / 2;

    if (kMasterKey.nDeriveIterations < 25000)
        kMasterKey.nDeriveIterations = 25000;

    WalletLogPrintf("Encrypting Wallet with an nDeriveIterations of %i\n", kMasterKey.nDeriveIterations);

    if (!crypter.SetKeyFromPassphrase(strWalletPassphrase, kMasterKey.vchSalt, kMasterKey.nDeriveIterations, kMasterKey.nDerivationMethod))
        return false;
    if (!crypter.Encrypt(_vMasterKey, kMasterKey.vchCryptedKey))
        return false;

    {
        LOCK2(m_relock_mutex, cs_wallet);
        mapMasterKeys[++nMasterKeyMaxID] = kMasterKey;
        WalletBatch* encrypted_batch = new WalletBatch(GetDatabase());
        if (!encrypted_batch->TxnBegin()) {
            delete encrypted_batch;
            encrypted_batch = nullptr;
            return false;
        }
        encrypted_batch->WriteMasterKey(nMasterKeyMaxID, kMasterKey);

        for (const auto& spk_man_pair : m_spk_managers) {
            auto spk_man = spk_man_pair.second.get();
            if (!spk_man->Encrypt(_vMasterKey, encrypted_batch)) {
                encrypted_batch->TxnAbort();
                delete encrypted_batch;
                encrypted_batch = nullptr;
                // We now probably have half of our keys encrypted in memory, and half not...
                // die and let the user reload the unencrypted wallet.
                assert(false);
            }
        }

        // Encryption was introduced in version 0.4.0
        SetMinVersion(FEATURE_WALLETCRYPT, encrypted_batch);

        if (!encrypted_batch->TxnCommit()) {
            delete encrypted_batch;
            encrypted_batch = nullptr;
            // We now have keys encrypted in memory, but not on disk...
            // die to avoid confusion and let the user reload the unencrypted wallet.
            assert(false);
        }

        delete encrypted_batch;
        encrypted_batch = nullptr;

        Lock();
        Unlock(strWalletPassphrase);

        // If we are using descriptors, make new descriptors with a new seed
        if (IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS) && !IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET)) {
            SetupDescriptorScriptPubKeyMans();
        } else if (auto spk_man = GetLegacyScriptPubKeyMan()) {
            // if we are using HD, replace the HD seed with a new one
            if (spk_man->IsHDEnabled()) {
                if (!spk_man->SetupGeneration(true)) {
                    return false;
                }
            }
        }
        Lock();

        // Need to completely rewrite the wallet file; if we don't, bdb might keep
        // bits of the unencrypted private key in slack space in the database file.
        GetDatabase().Rewrite();

        // BDB seems to have a bad habit of writing old data into
        // slack space in .dat files; that is bad if the old data is
        // unencrypted private keys. So:
        GetDatabase().ReloadDbEnv();

    }
    NotifyStatusChanged(this);

    return true;
}